

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_move_key_tag_to_val_tag(Parser *this)

{
  long in_RDI;
  bool bVar1;
  
  bVar1 = true;
  if (*(long *)(in_RDI + 0xa10) != 0) {
    bVar1 = *(long *)(in_RDI + 0xa08) == 0;
  }
  if (!bVar1) {
    *(undefined8 *)(in_RDI + 0xa30) = *(undefined8 *)(in_RDI + 0xa08);
    *(undefined8 *)(in_RDI + 0xa38) = *(undefined8 *)(in_RDI + 0xa10);
    *(undefined8 *)(in_RDI + 0xa28) = *(undefined8 *)(in_RDI + 0x9f8);
    basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0xa08));
    *(undefined8 *)(in_RDI + 0x9f8) = 0;
  }
  return;
}

Assistant:

void Parser::_move_key_tag_to_val_tag()
{
    if(m_key_tag.empty())
        return;
    _c4dbgpf("move key tag to val tag: key='{}' -> val='{}'", m_key_tag, m_val_tag);
    m_val_tag = m_key_tag;
    m_val_tag_indentation = m_key_tag_indentation;
    m_key_tag.clear();
    m_key_tag_indentation = 0;
}